

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitAggState<long>,long,duckdb::BitStringAggOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  long lVar1;
  FunctionData *pFVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  AggregateUnaryInput input_data;
  AggregateUnaryInput local_a0;
  Vector *local_88;
  ulong local_80;
  undefined1 local_78 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar1 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    local_88 = input + 0x28;
    local_78._16_8_ = 0;
    if (0x3f < count + 0x3f) {
      uVar6 = 0;
      local_80 = count;
      local_78._0_8_ = aggr_input_data;
      local_78._8_8_ = local_88;
      do {
        uVar3 = local_78._16_8_;
        if (*(long *)local_88 == 0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar5 = *(ulong *)(*(long *)local_88 + uVar6 * 8);
        }
        uVar7 = local_78._16_8_ + 0x40;
        if (local_80 <= local_78._16_8_ + 0x40) {
          uVar7 = local_80;
        }
        uVar4 = uVar7;
        if (uVar5 != 0) {
          if (uVar5 == 0xffffffffffffffff) {
            for (; uVar4 = local_78._16_8_, (ulong)local_78._16_8_ < uVar7;
                local_78._16_8_ = local_78._16_8_ + 1) {
              BitStringAggOperation::
              Operation<long,duckdb::BitAggState<long>,duckdb::BitStringAggOperation>
                        ((BitAggState<long> *)state,(long *)(local_78._16_8_ * 8 + lVar1),
                         (AggregateUnaryInput *)local_78);
            }
          }
          else {
            for (; uVar4 = local_78._16_8_, (ulong)local_78._16_8_ < uVar7;
                local_78._16_8_ = local_78._16_8_ + 1) {
              if ((uVar5 >> ((ulong)(uint)((int)local_78._16_8_ - (int)uVar3) & 0x3f) & 1) != 0) {
                BitStringAggOperation::
                Operation<long,duckdb::BitAggState<long>,duckdb::BitStringAggOperation>
                          ((BitAggState<long> *)state,(long *)(local_78._16_8_ * 8 + lVar1),
                           (AggregateUnaryInput *)local_78);
              }
            }
          }
        }
        local_78._16_8_ = uVar4;
        uVar6 = uVar6 + 1;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78._8_8_ = input + 0x28;
      local_78._16_8_ = 0;
      local_78._0_8_ = aggr_input_data;
      BitStringAggOperation::Operation<long,duckdb::BitAggState<long>,duckdb::BitStringAggOperation>
                ((BitAggState<long> *)state,*(long **)(input + 0x20),(AggregateUnaryInput *)local_78
                );
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    local_a0.input_mask = (ValidityMask *)(local_78 + 0x10);
    local_a0.input_idx = 0;
    local_a0.input = aggr_input_data;
    if (local_78._16_8_ == 0) {
      if (count != 0) {
        pFVar2 = ((optional_ptr<duckdb::FunctionData,_true> *)local_78._0_8_)->ptr;
        uVar6 = 0;
        do {
          local_a0.input_idx = uVar6;
          if (pFVar2 != (FunctionData *)0x0) {
            local_a0.input_idx = (idx_t)*(uint *)(pFVar2 + uVar6 * 4);
          }
          BitStringAggOperation::
          Operation<long,duckdb::BitAggState<long>,duckdb::BitStringAggOperation>
                    ((BitAggState<long> *)state,
                     (long *)(&((TemplatedValidityMask<unsigned_long> *)local_78._8_8_)->
                               validity_mask + local_a0.input_idx),&local_a0);
          uVar6 = uVar6 + 1;
        } while (count != uVar6);
      }
    }
    else if (count != 0) {
      pFVar2 = ((optional_ptr<duckdb::FunctionData,_true> *)local_78._0_8_)->ptr;
      uVar6 = 0;
      do {
        local_a0.input_idx = uVar6;
        if (pFVar2 != (FunctionData *)0x0) {
          local_a0.input_idx = (idx_t)*(uint *)(pFVar2 + uVar6 * 4);
        }
        if ((local_78._16_8_ == 0) ||
           ((*(ulong *)(local_78._16_8_ + (local_a0.input_idx >> 6) * 8) >>
             (local_a0.input_idx & 0x3f) & 1) != 0)) {
          BitStringAggOperation::
          Operation<long,duckdb::BitAggState<long>,duckdb::BitStringAggOperation>
                    ((BitAggState<long> *)state,
                     (long *)(&((TemplatedValidityMask<unsigned_long> *)local_78._8_8_)->
                               validity_mask + local_a0.input_idx),&local_a0);
        }
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}